

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

int SSE16x16_SSE2(uint8_t *a,uint8_t *b)

{
  int iVar1;
  int in_stack_0000007c;
  uint8_t *in_stack_00000080;
  uint8_t *in_stack_00000088;
  
  iVar1 = SSE_16xN_SSE2(in_stack_00000088,in_stack_00000080,in_stack_0000007c);
  return iVar1;
}

Assistant:

static int SSE16x16_SSE2(const uint8_t* WEBP_RESTRICT a,
                         const uint8_t* WEBP_RESTRICT b) {
  return SSE_16xN_SSE2(a, b, 8);
}